

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O1

void msg_flush(wchar_t x)

{
  ui_event uVar1;
  
  Term_putstr(x,L'\0',L'\xffffffff',L'\x0e',"-more-");
  if (((player->opts).opt[0x11] == false) && (keymap_auto_more == '\0')) {
    do {
      uVar1 = inkey_ex();
    } while (uVar1.type + ~EVT_MOUSE < 0xfffffffe);
  }
  Term_erase(L'\0',L'\0',L'ÿ');
  return;
}

Assistant:

static void msg_flush(int x)
{
	uint8_t a = COLOUR_L_BLUE;

	/* Pause for response */
	Term_putstr(x, 0, -1, a, "-more-");

	if ((!OPT(player, auto_more)) && !keymap_auto_more)
		anykey();

	/* Clear the line */
	Term_erase(0, 0, 255);
}